

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void updateNormalHints(_GLFWwindow *window,int width,int height)

{
  undefined4 uVar1;
  ulong *puVar2;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  XSizeHints *hints;
  
  puVar2 = (ulong *)XAllocSizeHints();
  if (*(long *)(in_RDI + 0x48) == 0) {
    if (*(int *)(in_RDI + 8) == 0) {
      *puVar2 = *puVar2 | 0x30;
      *(undefined4 *)(puVar2 + 4) = in_ESI;
      *(undefined4 *)(puVar2 + 3) = in_ESI;
      *(undefined4 *)((long)puVar2 + 0x24) = in_EDX;
      *(undefined4 *)((long)puVar2 + 0x1c) = in_EDX;
    }
    else {
      if ((*(int *)(in_RDI + 0x58) != -1) && (*(int *)(in_RDI + 0x5c) != -1)) {
        *puVar2 = *puVar2 | 0x10;
        *(undefined4 *)(puVar2 + 3) = *(undefined4 *)(in_RDI + 0x58);
        *(undefined4 *)((long)puVar2 + 0x1c) = *(undefined4 *)(in_RDI + 0x5c);
      }
      if ((*(int *)(in_RDI + 0x60) != -1) && (*(int *)(in_RDI + 100) != -1)) {
        *puVar2 = *puVar2 | 0x20;
        *(undefined4 *)(puVar2 + 4) = *(undefined4 *)(in_RDI + 0x60);
        *(undefined4 *)((long)puVar2 + 0x24) = *(undefined4 *)(in_RDI + 100);
      }
      if ((*(int *)(in_RDI + 0x68) != -1) && (*(int *)(in_RDI + 0x6c) != -1)) {
        *puVar2 = *puVar2 | 0x80;
        uVar1 = *(undefined4 *)(in_RDI + 0x68);
        *(undefined4 *)(puVar2 + 7) = uVar1;
        *(undefined4 *)(puVar2 + 6) = uVar1;
        uVar1 = *(undefined4 *)(in_RDI + 0x6c);
        *(undefined4 *)((long)puVar2 + 0x3c) = uVar1;
        *(undefined4 *)((long)puVar2 + 0x34) = uVar1;
      }
    }
  }
  *puVar2 = *puVar2 | 0x200;
  *(undefined4 *)(puVar2 + 9) = 10;
  XSetWMNormalHints(_glfw.x11.display,*(undefined8 *)(in_RDI + 0x350),puVar2);
  XFree(puVar2);
  return;
}

Assistant:

static void updateNormalHints(_GLFWwindow* window, int width, int height)
{
    XSizeHints* hints = XAllocSizeHints();

    if (!window->monitor)
    {
        if (window->resizable)
        {
            if (window->minwidth != GLFW_DONT_CARE &&
                window->minheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMinSize;
                hints->min_width = window->minwidth;
                hints->min_height = window->minheight;
            }

            if (window->maxwidth != GLFW_DONT_CARE &&
                window->maxheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMaxSize;
                hints->max_width = window->maxwidth;
                hints->max_height = window->maxheight;
            }

            if (window->numer != GLFW_DONT_CARE &&
                window->denom != GLFW_DONT_CARE)
            {
                hints->flags |= PAspect;
                hints->min_aspect.x = hints->max_aspect.x = window->numer;
                hints->min_aspect.y = hints->max_aspect.y = window->denom;
            }
        }
        else
        {
            hints->flags |= (PMinSize | PMaxSize);
            hints->min_width  = hints->max_width  = width;
            hints->min_height = hints->max_height = height;
        }
    }

    hints->flags |= PWinGravity;
    hints->win_gravity = StaticGravity;

    XSetWMNormalHints(_glfw.x11.display, window->x11.handle, hints);
    XFree(hints);
}